

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txid.cpp
# Opt level: O0

void __thiscall Txid_Txid256bit_Test::~Txid_Txid256bit_Test(Txid_Txid256bit_Test *this)

{
  Txid_Txid256bit_Test *this_local;
  
  ~Txid_Txid256bit_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Txid, Txid256bit) {
  ByteData256 byte_data = ByteData256(
      "3412907856341290785634129078563412907856341290785634129078563412");
  Txid txid = Txid(byte_data);
  EXPECT_STREQ(
      txid.GetHex().c_str(),
      "1234567890123456789012345678901234567890123456789012345678901234");
  EXPECT_EQ(txid.GetData().GetDataSize(), 32);
}